

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

bool __thiscall wallet::LegacyDataSPKM::HaveKey(LegacyDataSPKM *this,CKeyID *address)

{
  int iVar1;
  const_iterator cVar2;
  long in_FS_OFFSET;
  bool bVar3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock32;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(this->super_FillableSigningProvider).cs_KeyStore.super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  iVar1 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[9])();
  if ((char)iVar1 == '\0') {
    bVar3 = FillableSigningProvider::HaveKey(&this->super_FillableSigningProvider,address);
  }
  else {
    cVar2 = std::
            _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::find(&(this->mapCryptedKeys)._M_t,address);
    bVar3 = (_Rb_tree_header *)cVar2._M_node !=
            &(this->mapCryptedKeys)._M_t._M_impl.super__Rb_tree_header;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::HaveKey(const CKeyID &address) const
{
    LOCK(cs_KeyStore);
    if (!m_storage.HasEncryptionKeys()) {
        return FillableSigningProvider::HaveKey(address);
    }
    return mapCryptedKeys.count(address) > 0;
}